

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusNonStationary.cpp
# Opt level: O1

void __thiscall
PerseusNonStationary::InitializeBeliefs(PerseusNonStationary *this,int nrB,bool uniquify)

{
  undefined7 in_register_00000011;
  Arguments args;
  BeliefSetNonStationary local_270;
  Arguments local_258;
  
  ArgumentHandlers::Arguments::Arguments(&local_258);
  local_258.uniqueBeliefs = (int)CONCAT71(in_register_00000011,uniquify);
  local_258.nrBeliefs = nrB;
  AlphaVectorPlanning::SampleBeliefsNonStationary
            (&local_270,
             (AlphaVectorPlanning *)
             ((long)&(this->super_Perseus)._vptr_Perseus +
             (long)(this->super_Perseus)._vptr_Perseus[-3]),&local_258);
  SetBeliefSet(this,&local_270);
  BeliefSetNonStationary::~BeliefSetNonStationary(&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.maxplus_updateT._M_dataplus._M_p != &local_258.maxplus_updateT.field_2) {
    operator_delete(local_258.maxplus_updateT._M_dataplus._M_p,
                    local_258.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PerseusNonStationary::InitializeBeliefs(int nrB, bool uniquify)
{
    ArgumentHandlers::Arguments args;
    args.nrBeliefs=nrB;
    args.uniqueBeliefs=uniquify;
    SetBeliefSet(SampleBeliefsNonStationary(args));
}